

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

string * __thiscall toml::detail::either::expected_chars_abi_cxx11_(either *this,location *loc)

{
  size_type sVar1;
  scanner_storage *this_00;
  scanner_storage *psVar2;
  long in_RSI;
  string *in_RDI;
  size_t i;
  string *expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  location *in_stack_ffffffffffffff50;
  scanner_storage *in_stack_ffffffffffffff58;
  undefined8 local_58;
  
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::at
            ((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
              *)in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
  scanner_storage::expected_chars_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  sVar1 = std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::size((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                  *)(in_RSI + 8));
  if (sVar1 == 2) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::at
              ((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                *)in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
    scanner_storage::expected_chars_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50);
  }
  else {
    for (local_58 = 1;
        sVar1 = std::
                vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ::size((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                        *)(in_RSI + 8)), local_58 < sVar1; local_58 = local_58 + 1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
      this_00 = (scanner_storage *)(local_58 + 1);
      psVar2 = (scanner_storage *)
               std::
               vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               ::size((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                       *)(in_RSI + 8));
      if (this_00 == psVar2) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
      }
      in_stack_ffffffffffffff50 =
           (location *)
           std::
           vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::at
                     ((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                       *)in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      scanner_storage::expected_chars_abi_cxx11_(this_00,in_stack_ffffffffffffff50);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff50);
    }
  }
  return in_RDI;
}

Assistant:

TOML11_INLINE std::string either::expected_chars(location& loc) const
{
    assert( ! others_.empty());

    std::string expected = others_.at(0).expected_chars(loc);
    if(others_.size() == 2)
    {
        expected += " or ";
        expected += others_.at(1).expected_chars(loc);
    }
    else
    {
        for(std::size_t i=1; i<others_.size(); ++i)
        {
            expected += ", ";
            if(i + 1 == others_.size())
            {
                expected += "or ";
            }
            expected += others_.at(i).expected_chars(loc);
        }
    }
    return expected;
}